

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinPrimitiveEquals
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  double dVar1;
  uint uVar2;
  size_type sVar3;
  ostream *this_00;
  undefined8 uVar4;
  const_reference pvVar5;
  char *__s;
  Interpreter *this_01;
  string *msg;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_RDX;
  LocationRange *in_RSI;
  Interpreter *in_RDI;
  Value VVar6;
  bool r;
  stringstream ss;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffd18;
  LocationRange *in_stack_fffffffffffffd20;
  Interpreter *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  undefined4 in_stack_fffffffffffffd60;
  Type TVar7;
  undefined4 uStack_274;
  bool local_1f1;
  undefined4 uStack_1ec;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *local_20;
  LocationRange *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  sVar3 = std::
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          ::size(in_RDX);
  if (sVar3 == 2) {
    pvVar5 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
             ::operator[](local_20,0);
    TVar7 = pvVar5->t;
    pvVar5 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
             ::operator[](local_20,1);
    if (TVar7 == pvVar5->t) {
      pvVar5 = std::
               vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
               ::operator[](local_20,0);
      __s = (char *)(ulong)pvVar5->t;
      switch(__s) {
      case (char *)0x0:
        local_1f1 = true;
        break;
      case (char *)0x1:
        pvVar5 = std::
                 vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                 ::operator[](local_20,0);
        uVar2 = (uint)((pvVar5->v).b & 1);
        pvVar5 = std::
                 vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                 ::operator[](local_20,1);
        local_1f1 = uVar2 == ((pvVar5->v).b & 1);
        break;
      case (char *)0x2:
        pvVar5 = std::
                 vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                 ::operator[](local_20,0);
        dVar1 = (pvVar5->v).d;
        pvVar5 = std::
                 vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                 ::operator[](local_20,1);
        local_1f1 = dVar1 == (pvVar5->v).d;
        break;
      default:
        msg = (string *)__cxa_allocate_exception(0x38);
        std::
        vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
        ::operator[](local_20,0);
        (anonymous_namespace)::type_str_abi_cxx11_((Value *)msg);
        std::operator+((char *)in_stack_fffffffffffffd28,&local_18->file);
        makeError(in_stack_fffffffffffffd28,local_18,msg);
        __cxa_throw(msg,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
      case (char *)0x11:
        this_01 = (Interpreter *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(TVar7,in_stack_fffffffffffffd60),__s,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50))
        ;
        makeError(this_01,in_stack_fffffffffffffd20,(string *)in_stack_fffffffffffffd18);
        __cxa_throw(this_01,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
      case (char *)0x13:
        std::
        vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
        ::operator[](local_20,0);
        std::
        vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
        ::operator[](local_20,1);
        local_1f1 = std::operator==((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                     *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      }
      VVar6 = makeBoolean(in_RDI,local_1f1);
      *(ulong *)&in_RDI->scratch = CONCAT44(uStack_274,VVar6.t);
      (in_RDI->scratch).v = VVar6.v;
    }
    else {
      VVar6 = makeBoolean(in_RDI,false);
      *(ulong *)&in_RDI->scratch = CONCAT44(uStack_1ec,VVar6.t);
      (in_RDI->scratch).v = VVar6.v;
    }
    return (AST *)0x0;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  this_00 = std::operator<<(local_198,"primitiveEquals takes 2 parameters, got ");
  sVar3 = std::
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          ::size(local_20);
  std::ostream::operator<<(this_00,sVar3);
  uVar4 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  makeError(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,(string *)in_stack_fffffffffffffd18)
  ;
  __cxa_throw(uVar4,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *builtinPrimitiveEquals(const LocationRange &loc, const std::vector<Value> &args)
    {
        if (args.size() != 2) {
            std::stringstream ss;
            ss << "primitiveEquals takes 2 parameters, got " << args.size();
            throw makeError(loc, ss.str());
        }
        if (args[0].t != args[1].t) {
            scratch = makeBoolean(false);
            return nullptr;
        }
        bool r;
        switch (args[0].t) {
            case Value::BOOLEAN: r = args[0].v.b == args[1].v.b; break;

            case Value::NUMBER: r = args[0].v.d == args[1].v.d; break;

            case Value::STRING:
                r = static_cast<HeapString *>(args[0].v.h)->value ==
                    static_cast<HeapString *>(args[1].v.h)->value;
                break;

            case Value::NULL_TYPE: r = true; break;

            case Value::FUNCTION: throw makeError(loc, "cannot test equality of functions"); break;

            default:
                throw makeError(loc,
                                "primitiveEquals operates on primitive "
                                "types, got " +
                                    type_str(args[0]));
        }
        scratch = makeBoolean(r);
        return nullptr;
    }